

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s98player.cpp
# Opt level: O0

void S98Player::SndEmuLogCB(void *userParam,void *source,UINT8 level,char *message)

{
  long lVar1;
  code *pcVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  S98Player *player;
  DEVLOG_CB_DATA *cbData;
  char *message_local;
  UINT8 level_local;
  void *source_local;
  void *userParam_local;
  
  lVar1 = *userParam;
  if ((*(long *)(lVar1 + 0x30) != 0) && (((*(byte *)(lVar1 + 0x1ea8) & 8) == 0 || (level < 2)))) {
    pcVar2 = *(code **)(lVar1 + 0x30);
    uVar3 = *(undefined8 *)(lVar1 + 0x38);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)(lVar1 + 0x1dd8),*(size_type *)((long)userParam + 8));
    uVar4 = std::__cxx11::string::c_str();
    (*pcVar2)(uVar3,lVar1,level,1,uVar4,message);
  }
  return;
}

Assistant:

void S98Player::SndEmuLogCB(void* userParam, void* source, UINT8 level, const char* message)
{
	DEVLOG_CB_DATA* cbData = (DEVLOG_CB_DATA*)userParam;
	S98Player* player = cbData->player;
	if (player->_logCbFunc == NULL)
		return;
	if ((player->_playState & PLAYSTATE_SEEK) && level > PLRLOG_ERROR)
		return;	// prevent message spam while seeking
	player->_logCbFunc(player->_logCbParam, player, level, PLRLOGSRC_EMU,
		player->_devNames[cbData->chipDevID].c_str(), message);
	return;
}